

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void lj_record_ret(jit_State *J,BCReg rbase,ptrdiff_t gotresults)

{
  byte bVar1;
  ulong uVar2;
  code *pcVar3;
  IRIns *pIVar4;
  TValue *pTVar5;
  TValue TVar6;
  TRef TVar7;
  TRef TVar8;
  ulong uVar9;
  ushort uVar10;
  TValue TVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  TraceNo lnk;
  long lVar15;
  long lVar16;
  IRIns o;
  ushort uVar17;
  TraceLink linktype;
  TRef *pTVar18;
  TValue *pTVar20;
  uint uVar21;
  ulong uVar19;
  
  uVar19 = (ulong)rbase;
  pTVar20 = J->L->base + -1;
  lVar16 = gotresults;
  uVar9 = uVar19;
  if (0 < gotresults) {
    do {
      if (J->base[uVar9] == 0) {
        sload(J,(int32_t)uVar9);
      }
      lVar16 = lVar16 + -1;
      uVar9 = uVar9 + 1;
    } while (lVar16 != 0);
  }
  uVar9 = pTVar20->u64;
  uVar13 = (uint)uVar9;
  while (uVar21 = (uint)uVar19, (~uVar13 & 6) == 0) {
    iVar14 = J->framedepth;
    J->framedepth = iVar14 + -1;
    if (iVar14 < 2) goto LAB_0012e531;
    iVar14 = (int)(uVar9 >> 3);
    J->baseslot = J->baseslot - iVar14;
    gotresults = gotresults + 1;
    pTVar18 = (TRef *)((long)J->base - (uVar9 >> 1 & 0x3fffffffc));
    J->base = pTVar18;
    uVar19 = (ulong)((uVar21 + iVar14) - 1);
    pTVar18[uVar19] = 0x2007ffd;
    uVar2 = pTVar20->u64;
    J->needsnap = '\x01';
    uVar9 = *(ulong *)((long)pTVar20 - (uVar2 & 0xfffffffffffffff8));
    pTVar20 = (TValue *)((long)pTVar20 - (uVar2 & 0xfffffffffffffff8));
    uVar13 = (uint)uVar9;
  }
  iVar14 = J->framedepth;
  if ((((iVar14 == 0) && (J->pt != (GCproto *)0x0)) && (0xfffffffb < (byte)*J->pc - 0x4d)) &&
     (((uVar9 & 3) != 0 ||
      (((J->parent == 0 && (J->exitno == 0)) && ((byte)(J->cur).startins - 0x4d < 0xfffffffc)))))) {
    if (uVar21 != 0) {
      memset(J->base,0,uVar19 << 2);
    }
    J->maxslot = uVar21 + (int)gotresults;
    linktype = LJ_TRLINK_RETURN;
    lnk = 0;
LAB_0012e179:
    lj_record_stop(J,linktype,lnk);
    return;
  }
  if (((uint)uVar9 & 7) == 3) {
    J->framedepth = iVar14 + -1;
    if (iVar14 < 1) goto LAB_0012e531;
    iVar12 = (int)(uVar9 >> 3);
    J->baseslot = J->baseslot - iVar12;
    J->base = (TRef *)((long)J->base - (uVar9 >> 1 & 0x3fffffffc));
    uVar21 = uVar21 + iVar12;
    uVar9 = *(ulong *)((long)pTVar20 - (pTVar20->u64 & 0xfffffffffffffff8));
    pTVar20 = (TValue *)((long)pTVar20 - (pTVar20->u64 & 0xfffffffffffffff8));
    iVar14 = iVar14 + -1;
  }
  if ((uVar9 & 3) == 0) {
    uVar13 = *(uint *)(uVar9 - 4);
    lVar16 = (ulong)(uVar13 >> 0x18) - 1;
    if (uVar13 < 0x1000000) {
      lVar16 = gotresults;
    }
    uVar13 = uVar13 >> 8 & 0xff;
    iVar12 = uVar13 + 2;
    lVar15 = *(long *)((*(ulong *)((long)pTVar20 + (-8 - (ulong)(uint)(iVar12 * 8))) &
                       0x7fffffffffff) + 0x20);
    if ((*(byte *)(lVar15 + -0x2b) & 8) != 0) {
      lj_trace_err(J,LJ_TRERR_CJITOFF);
    }
    o = (IRIns)(lVar15 + -0x68);
    if (((iVar14 == 0) && (J->pt != (GCproto *)0x0)) && (pTVar20 == J->L->base + -1)) {
      uVar10 = J->chain[0x18];
      if (uVar10 != 0) {
        pIVar4 = (J->cur).ir;
        do {
          if ((o == pIVar4[(ulong)uVar10 + 1]) && (uVar17 = J->chain[0xb], uVar17 != 0)) {
            iVar14 = 0;
            do {
              uVar19 = (ulong)uVar17;
              uVar17 = *(ushort *)((long)pIVar4 + uVar19 * 8 + 6);
              iVar14 = iVar14 + (uint)(pIVar4[uVar19].field_0.op1 == uVar10);
            } while (uVar17 != 0);
            if (iVar14 != 0) {
              if (J->pc != J->startpc) {
                lj_trace_err(J,LJ_TRERR_DOWNREC);
              }
              if (J->param[0xc] < iVar14 + J->tailcalled) {
                J->maxslot = uVar21 + (int)gotresults;
                lj_snap_purge(J);
                lnk = (TraceNo)(J->cur).traceno;
                linktype = LJ_TRLINK_DOWNREC;
                goto LAB_0012e179;
              }
            }
          }
          uVar10 = *(ushort *)((long)pIVar4 + (ulong)uVar10 * 8 + 6);
        } while (uVar10 != 0);
      }
      lj_snap_add(J);
    }
    if (0 < lVar16) {
      pTVar18 = J->base;
      lVar15 = 0;
      do {
        TVar8 = 0x7fff;
        if (lVar15 < gotresults) {
          TVar8 = pTVar18[(ulong)uVar21 + lVar15];
        }
        pTVar18[lVar15 + -2] = TVar8;
        lVar15 = lVar15 + 1;
      } while (lVar16 != lVar15);
    }
    J->maxslot = uVar13 + (int)lVar16;
    if (0 < J->framedepth) {
      J->framedepth = J->framedepth + -1;
      J->baseslot = J->baseslot - iVar12;
      J->base = J->base + (-2 - (ulong)uVar13);
      return;
    }
    if (((J->parent == 0) && (J->exitno == 0)) && ((byte)(J->cur).startins - 0x4d < 0xfffffffc)) {
      lj_trace_err(J,LJ_TRERR_LLEAVE);
    }
    if (J->needsnap == '\0') {
      TVar8 = lj_ir_kgc(J,(GCobj *)o,IRT_PROTO);
      TVar7 = lj_ir_kptr_(J,IR_KPTR,(void *)*pTVar20);
      (J->fold).ins.field_0.ot = 0xb89;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
      lj_opt_fold(J);
      J->retdepth = J->retdepth + 1;
      J->needsnap = '\x01';
      memmove(J->base + uVar13,J->base + -2,lVar16 << 2);
      memset(J->base + -2,0,(ulong)(uint)(iVar12 * 4));
      return;
    }
  }
  else if (((uint)uVar9 & 7) == 2) {
    pcVar3 = (code *)pTVar20[-3].u64;
    J->framedepth = iVar14 + -2;
    if (1 < iVar14) {
      iVar14 = (int)(uVar9 >> 3);
      J->baseslot = J->baseslot - iVar14;
      uVar19 = uVar9 >> 3 & 0xffffffff;
      pTVar18 = J->base + -uVar19;
      J->base = pTVar18;
      uVar13 = iVar14 - 4;
      J->maxslot = uVar13;
      if (pcVar3 == lj_cont_ra) {
        bVar1 = *(byte *)(pTVar20[-2].u64 - 3);
        if (gotresults == 0) {
          TVar8 = 0x7fff;
        }
        else {
          TVar8 = pTVar18[uVar21 + iVar14];
        }
        pTVar18[bVar1] = TVar8;
        if ((uint)bVar1 < J->maxslot) {
          return;
        }
        J->maxslot = bVar1 + 1;
        return;
      }
      if (pcVar3 != lj_cont_cat) {
        return;
      }
      bVar1 = *(byte *)(pTVar20[-2].u64 - 1);
      if (gotresults == 0) {
        TVar8 = 0x7fff;
      }
      else {
        TVar8 = pTVar18[iVar14 + uVar21];
      }
      if (bVar1 != uVar13) {
        if (J->postproc != LJ_POST_NONE) goto LAB_0012e531;
        pTVar5 = J->L->base;
        pTVar18[uVar13] = TVar8;
        TVar6 = pTVar5[-4];
        if (gotresults == 0) {
          TVar11.u64 = 0xffffffffffffffff;
        }
        else {
          TVar11 = pTVar5[uVar21];
        }
        pTVar5[-4] = TVar11;
        J->L->base = pTVar5 + -uVar19;
        TVar8 = rec_cat(J,(uint)bVar1,uVar13);
        pTVar5 = J->L->base + uVar19;
        J->L->base = pTVar5;
        pTVar5[-4] = TVar6;
      }
      if (TVar8 == 0) {
        return;
      }
      bVar1 = *(byte *)(pTVar20[-2].u64 - 3);
      J->base[bVar1] = TVar8;
      if ((uint)bVar1 < J->maxslot) {
        return;
      }
      J->maxslot = bVar1 + 1;
      return;
    }
  }
LAB_0012e531:
  lj_trace_err(J,LJ_TRERR_NYIRETL);
}

Assistant:

void lj_record_ret(jit_State *J, BCReg rbase, ptrdiff_t gotresults)
{
  TValue *frame = J->L->base - 1;
  ptrdiff_t i;
  for (i = 0; i < gotresults; i++)
    (void)getslot(J, rbase+i);  /* Ensure all results have a reference. */
  while (frame_ispcall(frame)) {  /* Immediately resolve pcall() returns. */
    BCReg cbase = (BCReg)frame_delta(frame);
    if (--J->framedepth <= 0)
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    lj_assertJ(J->baseslot > 1+LJ_FR2, "bad baseslot for return");
    gotresults++;
    rbase += cbase;
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    J->base[--rbase] = TREF_TRUE;  /* Prepend true to results. */
    frame = frame_prevd(frame);
    J->needsnap = 1;  /* Stop catching on-trace errors. */
  }
  /* Return to lower frame via interpreter for unhandled cases. */
  if (J->framedepth == 0 && J->pt && bc_isret(bc_op(*J->pc)) &&
       (!frame_islua(frame) ||
	(J->parent == 0 && J->exitno == 0 &&
	 !bc_isret(bc_op(J->cur.startins))))) {
    /* NYI: specialize to frame type and return directly, not via RET*. */
    for (i = 0; i < (ptrdiff_t)rbase; i++)
      J->base[i] = 0;  /* Purge dead slots. */
    J->maxslot = rbase + (BCReg)gotresults;
    lj_record_stop(J, LJ_TRLINK_RETURN, 0);  /* Return to interpreter. */
    return;
  }
  if (frame_isvarg(frame)) {
    BCReg cbase = (BCReg)frame_delta(frame);
    if (--J->framedepth < 0)  /* NYI: return of vararg func to lower frame. */
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    lj_assertJ(J->baseslot > 1+LJ_FR2, "bad baseslot for return");
    rbase += cbase;
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    frame = frame_prevd(frame);
  }
  if (frame_islua(frame)) {  /* Return to Lua frame. */
    BCIns callins = *(frame_pc(frame)-1);
    ptrdiff_t nresults = bc_b(callins) ? (ptrdiff_t)bc_b(callins)-1 :gotresults;
    BCReg cbase = bc_a(callins);
    GCproto *pt = funcproto(frame_func(frame - (cbase+1+LJ_FR2)));
    if ((pt->flags & PROTO_NOJIT))
      lj_trace_err(J, LJ_TRERR_CJITOFF);
    if (J->framedepth == 0 && J->pt && frame == J->L->base - 1) {
      if (check_downrec_unroll(J, pt)) {
	J->maxslot = (BCReg)(rbase + gotresults);
	lj_snap_purge(J);
	lj_record_stop(J, LJ_TRLINK_DOWNREC, J->cur.traceno);  /* Down-rec. */
	return;
      }
      lj_snap_add(J);
    }
    for (i = 0; i < nresults; i++)  /* Adjust results. */
      J->base[i-1-LJ_FR2] = i < gotresults ? J->base[rbase+i] : TREF_NIL;
    J->maxslot = cbase+(BCReg)nresults;
    if (J->framedepth > 0) {  /* Return to a frame that is part of the trace. */
      J->framedepth--;
      lj_assertJ(J->baseslot > cbase+1+LJ_FR2, "bad baseslot for return");
      J->baseslot -= cbase+1+LJ_FR2;
      J->base -= cbase+1+LJ_FR2;
    } else if (J->parent == 0 && J->exitno == 0 &&
	       !bc_isret(bc_op(J->cur.startins))) {
      /* Return to lower frame would leave the loop in a root trace. */
      lj_trace_err(J, LJ_TRERR_LLEAVE);
    } else if (J->needsnap) {  /* Tailcalled to ff with side-effects. */
      lj_trace_err(J, LJ_TRERR_NYIRETL);  /* No way to insert snapshot here. */
    } else {  /* Return to lower frame. Guard for the target we return to. */
      TRef trpt = lj_ir_kgc(J, obj2gco(pt), IRT_PROTO);
      TRef trpc = lj_ir_kptr(J, (void *)frame_pc(frame));
      emitir(IRTG(IR_RETF, IRT_PGC), trpt, trpc);
      J->retdepth++;
      J->needsnap = 1;
      lj_assertJ(J->baseslot == 1+LJ_FR2, "bad baseslot for return");
      /* Shift result slots up and clear the slots of the new frame below. */
      memmove(J->base + cbase, J->base-1-LJ_FR2, sizeof(TRef)*nresults);
      memset(J->base-1-LJ_FR2, 0, sizeof(TRef)*(cbase+1+LJ_FR2));
    }
  } else if (frame_iscont(frame)) {  /* Return to continuation frame. */
    ASMFunction cont = frame_contf(frame);
    BCReg cbase = (BCReg)frame_delta(frame);
    if ((J->framedepth -= 2) < 0)
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    J->maxslot = cbase-(2<<LJ_FR2);
    if (cont == lj_cont_ra) {
      /* Copy result to destination slot. */
      BCReg dst = bc_a(*(frame_contpc(frame)-1));
      J->base[dst] = gotresults ? J->base[cbase+rbase] : TREF_NIL;
      if (dst >= J->maxslot) {
	J->maxslot = dst+1;
      }
    } else if (cont == lj_cont_nop) {
      /* Nothing to do here. */
    } else if (cont == lj_cont_cat) {
      BCReg bslot = bc_b(*(frame_contpc(frame)-1));
      TRef tr = gotresults ? J->base[cbase+rbase] : TREF_NIL;
      if (bslot != J->maxslot) {  /* Concatenate the remainder. */
	TValue *b = J->L->base, save;  /* Simulate lower frame and result. */
	/* Can't handle MM_concat + CALLT + fast func side-effects. */
	if (J->postproc != LJ_POST_NONE)
	  lj_trace_err(J, LJ_TRERR_NYIRETL);
	J->base[J->maxslot] = tr;
	copyTV(J->L, &save, b-(2<<LJ_FR2));
	if (gotresults)
	  copyTV(J->L, b-(2<<LJ_FR2), b+rbase);
	else
	  setnilV(b-(2<<LJ_FR2));
	J->L->base = b - cbase;
	tr = rec_cat(J, bslot, cbase-(2<<LJ_FR2));
	b = J->L->base + cbase;  /* Undo. */
	J->L->base = b;
	copyTV(J->L, b-(2<<LJ_FR2), &save);
      }
      if (tr) {  /* Store final result. */
	BCReg dst = bc_a(*(frame_contpc(frame)-1));
	J->base[dst] = tr;
	if (dst >= J->maxslot) {
	  J->maxslot = dst+1;
	}
      }  /* Otherwise continue with another __concat call. */
    } else {
      /* Result type already specialized. */
      lj_assertJ(cont == lj_cont_condf || cont == lj_cont_condt,
		 "bad continuation type");
    }
  } else {
    lj_trace_err(J, LJ_TRERR_NYIRETL);  /* NYI: handle return to C frame. */
  }
  lj_assertJ(J->baseslot >= 1+LJ_FR2, "bad baseslot for return");
}